

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall BaseFSNode::Serialize(BaseFSNode *this,CJSON *json)

{
  CJSON *this_00;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  CJSON *local_18;
  CJSON *json_local;
  BaseFSNode *this_local;
  
  local_18 = json;
  json_local = (CJSON *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"name",&local_39);
  CJSON::AddPair<std::__cxx11::string>(json,&local_38,&this->m_Name);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  this_00 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"path",&local_71);
  CJSON::AddPair<std::__cxx11::string>(this_00,&local_70,&this->m_Path);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  return;
}

Assistant:

void Serialize(CJSON &json) const
        {
            json.AddPair("name", m_Name);
            json.AddPair("path", m_Path);
        }